

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

void __thiscall
TidyConfigParser::toggleAllGroupChecks(TidyConfigParser *this,string *groupName,CheckStatus status)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  undefined8 extraout_RAX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type sVar4;
  TidyKind kind;
  bool bVar5;
  format_args args;
  string_view fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar1 = (groupName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + groupName->_M_string_length);
  _Var2._M_p = local_88._M_dataplus._M_p;
  if (local_88._M_string_length != 0) {
    sVar4 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar4]);
      _Var2._M_p[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (local_88._M_string_length != sVar4);
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_88,"synthesis");
  bVar5 = true;
  kind = Synthesis;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_88,"synth");
    kind = Synthesis;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_88,"style");
      bVar5 = iVar3 == 0;
      kind = Style;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    TidyConfig::toggleGroup(&this->config,kind,status);
    return;
  }
  local_48 = (groupName->_M_dataplus)._M_p;
  sStack_40 = groupName->_M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_48;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x17;
  ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"Group {} does not exist",fmt,args);
  reportErrorAndExit(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TidyConfigParser::toggleAllGroupChecks(const std::string& groupName,
                                            TidyConfig::CheckStatus status) {
    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));

    config.toggleGroup(kind.value(), status);
}